

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beman_s_challenge.cc
# Opt level: O1

int main(void)

{
  int iVar1;
  vec2i position;
  char cVar2;
  bool bVar3;
  vec2i vVar4;
  long lVar5;
  window *pwVar6;
  vec2i position_00;
  long lVar7;
  long lVar8;
  vec2f vVar9;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  string_view title;
  color4f color;
  color4f color_00;
  optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
  maybe_event;
  window window;
  renderer renderer;
  float local_ac;
  _Storage<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true>
  local_a8;
  char local_98;
  ulong local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  window local_68;
  renderer local_58;
  
  title._M_str = "Beman\'s challenge";
  title._M_len = 0x11;
  hmi::window::window(&local_68,title,(vec2i)0x24000000400,decorated|visible|resizable);
  hmi::window::get_renderer(&local_58,&local_68);
  vVar4 = hmi::window::get_size(&local_68);
  local_78 = ((float)vVar4.field_0._0_4_ + -610.0) * 0.5;
  fStack_74 = ((float)vVar4.field_0._4_4_ + -48.541023) * 0.5;
  fStack_70 = 0.0;
  fStack_6c = 0.0;
  local_88 = local_88 & 0xffffffff00000000;
  local_90 = 0;
  local_ac = 0.0;
  while( true ) {
    bVar3 = hmi::window::is_open(&local_68);
    if (!bVar3) break;
    do {
      pwVar6 = &local_68;
      hmi::window::poll_event
                ((optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
                  *)&local_a8._M_value,&local_68);
      cVar2 = local_98;
      if (local_98 != '\0') {
        if (local_a8._M_value.
            super__Variant_base<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
            .
            super__Move_assign_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
            .
            super__Copy_assign_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
            .
            super__Move_ctor_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
            .
            super__Copy_ctor_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
            .
            super__Variant_storage_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
            ._M_index == '\x01') {
          hmi::window::close(&local_68,(int)pwVar6);
        }
        else if (local_a8._M_value.
                 super__Variant_base<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                 .
                 super__Move_assign_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                 .
                 super__Copy_assign_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                 .
                 super__Move_ctor_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                 .
                 super__Copy_ctor_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                 .
                 super__Variant_storage_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                 ._M_index == '\a') {
          position.field_0.data[1] = local_a8._8_4_;
          position.field_0.data[0] = local_a8._4_4_;
          vVar9 = hmi::renderer::get_coords_from_position(&local_58,position);
          if ((local_78 <= vVar9.field_0._0_4_) && (vVar9.field_0._0_4_ <= local_78 + 610.0)) {
            if ((fStack_74 <= vVar9.field_0._4_4_) && (vVar9.field_0._4_4_ <= fStack_74 + 48.541023)
               ) {
              local_88._0_4_ = (float)(int)local_a8._4_4_;
              local_ac = (float)(int)local_a8._8_4_;
              local_90 = CONCAT71((int7)((ulong)&local_a8 >> 8),1);
            }
          }
        }
        else if (local_a8._M_value.
                 super__Variant_base<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                 .
                 super__Move_assign_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                 .
                 super__Copy_assign_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                 .
                 super__Move_ctor_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                 .
                 super__Copy_ctor_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                 .
                 super__Variant_storage_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                 ._M_index == '\b') {
          local_90 = 0;
        }
        else if (local_a8._M_value.
                 super__Variant_base<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                 .
                 super__Move_assign_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                 .
                 super__Copy_assign_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                 .
                 super__Move_ctor_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                 .
                 super__Copy_ctor_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                 .
                 super__Variant_storage_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                 ._M_index == '\t') {
          if ((local_90 & 1) != 0) {
            position_00.field_0._0_4_ = (int)(float)(undefined4)local_88;
            position_00.field_0.data[1] = (int)local_ac;
            local_88 = (vec_accessor<float,_2UL,_0UL>)
                       hmi::renderer::get_coords_from_position(&local_58,position_00);
            vVar4.field_0.data[1] = local_a8._4_4_;
            vVar4.field_0.data[0] = local_a8._0_4_;
            uStack_80 = extraout_XMM0_Qb;
            vVar9 = hmi::renderer::get_coords_from_position(&local_58,vVar4);
            local_78 = local_78 + (vVar9.field_0._0_4_ - (float)(undefined4)local_88);
            fStack_74 = fStack_74 + (vVar9.field_0._4_4_ - local_88._4_4_);
            fStack_70 = fStack_70 + ((float)extraout_XMM0_Qb_00 - (float)uStack_80);
            fStack_6c = fStack_6c + ((float)((ulong)extraout_XMM0_Qb_00 >> 0x20) - uStack_80._4_4_);
          }
          local_88._0_4_ = (float)(int)local_a8._0_4_;
          local_ac = (float)(int)local_a8._4_4_;
        }
        else if (local_a8._M_value.
                 super__Variant_base<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                 .
                 super__Move_assign_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                 .
                 super__Copy_assign_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                 .
                 super__Move_ctor_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                 .
                 super__Copy_ctor_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                 .
                 super__Variant_storage_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                 ._M_index == '\0') {
          local_58.m_view_size.field_0._0_4_ = (float)(int)local_a8._0_4_;
          local_58.m_view_size.field_0._4_4_ = (float)(int)local_a8._4_4_;
        }
      }
    } while (cVar2 != '\0');
    color.field_0._8_8_ = 0x3f8000003f800000;
    color.field_0._0_8_ = 0x3f8000003f800000;
    hmi::renderer::clear(&local_58,color);
    lVar8 = 0;
    lVar7 = 0;
    do {
      iVar1 = (&_ZL12g_hello_text_rel)[lVar7];
      lVar5 = 0;
      do {
        if (*(char *)((long)&_ZL12g_hello_text_rel + lVar5 + iVar1) == '#') {
          vVar9.field_0._0_4_ = (float)(int)(lVar8 + lVar5) * 10.0 + local_78;
          vVar9.field_0._4_4_ = (float)(int)((ulong)(lVar8 + lVar5) >> 0x20) * 9.708204 + fStack_74;
          color_00.field_0._8_8_ = 0x3f80000000000000;
          color_00.field_0._0_8_ = 0x3f800000;
          hmi::renderer::fill_rectangle(&local_58,vVar9,(vec2f)0x411b54ce41200000,color_00);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x3d);
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x100000000;
    } while (lVar7 != 5);
    hmi::renderer::display(&local_58);
  }
  hmi::renderer::~renderer(&local_58);
  hmi::window::~window(&local_68);
  return 0;
}

Assistant:

int main() {
  hmi::window window("Beman's challenge", { 1024, 576 });

  auto renderer = window.get_renderer();

  hmi::vec2i hello_size = { static_cast<int>(std::strlen(g_hello_text[0])), 5 };
  hmi::vec2f pixel_size = { 10.0f, 10.0f * 3 / 5 * 1.61803398875f };
  hmi::vec2f size = hello_size * pixel_size;

  hmi::vec2f position = (window.get_size() - size) / 2;
  bool dragging = false;
  hmi::vec2f mouse_position = { 0, 0 };

  while (window.is_open()) {

    while (auto maybe_event = window.poll_event()) {
      auto& event = maybe_event.value();

      if (std::get_if<hmi::window_events::closed>(&event)) {
        window.close();
      } else if (auto pevent = std::get_if<hmi::window_events::mouse_button_pressed>(&event)) {
        hmi::vec2f cursor = renderer.get_coords_from_position(pevent->position);

        if (position.x <= cursor.x && cursor.x <= position.x + size.width && position.y <= cursor.y && cursor.y <= position.y + size.height) {
          dragging = true;
          mouse_position = pevent->position;
        }
      } else if (std::get_if<hmi::window_events::mouse_button_released>(&event)) {
        dragging = false;
      } else if (auto pevent = std::get_if<hmi::window_events::mouse_moved>(&event)) {
        if (dragging) {
          hmi::vec2f old_cursor = renderer.get_coords_from_position(mouse_position);
          hmi::vec2f new_cursor = renderer.get_coords_from_position(pevent->position);
          position += (new_cursor - old_cursor);
        }

        mouse_position = pevent->position;
      } else if (auto pevent = std::get_if<hmi::window_events::resized>(&event)) {
        renderer.set_view_size(pevent->size);
      }

    }

    renderer.clear(hmi::color::white);

    hmi::vec2i index;

    for (index.y = 0; index.y < hello_size.height; index.y++) {
      for (index.x = 0; index.x < hello_size.width; ++index.x) {
        if (g_hello_text[index.y][index.x] == '#') {
          hmi::vec2f pixel_position = position + index * pixel_size;
          renderer.fill_rectangle(pixel_position, pixel_size, hmi::color::red);
        }
      }
    }

    renderer.display();
  }

  return 0;
}